

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O1

bool basisu::unpack_pvrtc2(void *p,color_rgba *pPixels)

{
  uint uVar1;
  byte bVar2;
  color_rgba cVar3;
  uint uVar4;
  uint32_t i;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ushort uVar12;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ushort uVar21;
  color_rgba color_b;
  color_rgba color_a;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_48;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  undefined1 uStack_3c;
  byte bStack_3b;
  byte bStack_3a;
  byte bStack_39;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_30;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_2c;
  
  uVar1 = *(uint *)((long)p + 4);
  if ((uVar1 & 0x8001) == 0x8000) {
    if ((int)uVar1 < 0) {
      uVar4 = uVar1 >> 1 & 0xf;
      uVar4 = ((uVar1 >> 7 & 7 | uVar1 >> 2 & 0xf8) << 8 |
               (uVar4 >> 1 | uVar1 >> 1 & 8 | uVar4 << 4) << 0x10 |
              uVar1 >> 0xc & 7 | uVar1 >> 7 & 0xf8) - 0x1000000;
      local_48.m_comps[0] = (uint8_t)uVar4;
      local_48.m_comps[1] = (uint8_t)(uVar4 >> 8);
      local_48.m_comps[2] = (uint8_t)(uVar4 >> 0x10);
      local_48.m_comps[3] = (uint8_t)(uVar4 >> 0x18);
      uVar8 = uVar1 >> 0x1c & 7 | uVar1 >> 0x17 & 0xf8;
      uVar5 = uVar1 >> 0x17 & 7 | uVar1 >> 0x12 & 0xf8;
      uVar7 = uVar1 >> 0x12 & 7 | uVar1 >> 0xd & 0xf8;
      uStack_3c = (undefined1)uVar8;
      bStack_3b = (byte)uVar5;
      bStack_3a = (byte)uVar7;
      bStack_39 = 0xff;
      uVar9 = uVar8 * 3 + (uVar4 & 0xff) * 5 >> 3;
      uVar10 = uVar5 * 3 + (uint)local_48.m_comps[1] + (uint)local_48.m_comps[1] * 4 >> 3;
      uVar11 = uVar7 * 3 + (uint)local_48.m_comps[2] + (uint)local_48.m_comps[2] * 4 >> 3;
      cStack_44 = (char)uVar9;
      if (0xfe < uVar9) {
        cStack_44 = 0xff;
      }
      cStack_43 = (char)uVar10;
      if (0xfe < uVar10) {
        cStack_43 = 0xff;
      }
      cStack_42 = (char)uVar11;
      if (0xfe < uVar11) {
        cStack_42 = 0xff;
      }
      cStack_41 = 0xff;
      uVar4 = uVar8 * 5 + (uVar4 & 0xff) * 3 >> 3;
      uVar5 = uVar5 * 5 + (uint)local_48.m_comps[1] + (uint)local_48.m_comps[1] * 2 >> 3;
      uVar7 = uVar7 * 5 + (uint)local_48.m_comps[2] + (uint)local_48.m_comps[2] * 2 >> 3;
      if (0xfe < uVar4) {
        uVar4 = 0xff;
      }
      cStack_40 = (char)uVar4;
      cStack_3f = (char)uVar5;
      if (0xfe < uVar5) {
        cStack_3f = 0xff;
      }
      cStack_3e = (char)uVar7;
      if (0xfe < uVar7) {
        cStack_3e = 0xff;
      }
      cStack_3d = 0xff;
    }
    else {
      uVar4 = uVar1 >> 8 & 0xf;
      local_2c.m_comps[0] = (char)(uVar4 >> 3) + (char)uVar4 * '\x02';
      uVar4 = uVar1 >> 4 & 0xf;
      local_2c.m_comps[1] = (char)(uVar4 >> 3) + (char)uVar4 * '\x02';
      uVar4 = uVar1 >> 1 & 7;
      local_2c.m_comps[2] = (char)(uVar4 >> 1) + (char)uVar4 * '\x04';
      local_2c.m_comps[3] = (byte)(uVar1 >> 0xb) & 0xe;
      uVar4 = uVar1 >> 0x18 & 0xf;
      local_30.m_comps[0] = (char)(uVar4 >> 3) + (char)uVar4 * '\x02';
      uVar4 = uVar1 >> 0x14 & 0xf;
      local_30.m_comps[1] = (char)(uVar4 >> 3) + (char)uVar4 * '\x02';
      uVar4 = uVar1 >> 0x10 & 0xf;
      local_30.m_comps[2] = (char)(uVar4 >> 3) + (char)uVar4 * '\x02';
      local_30.m_comps[3] = (byte)(uVar1 >> 0x1b) | 1;
      cVar3 = convert_rgba_5554_to_8888((color_rgba *)&local_2c.field_1);
      local_48.m_comps[0] = cVar3.field_0._0_1_;
      local_48.m_comps[1] = cVar3.field_0._1_1_;
      local_48.m_comps[2] = cVar3.field_0._2_1_;
      local_48.m_comps[3] = cVar3.field_0._3_1_;
      cVar3 = convert_rgba_5554_to_8888((color_rgba *)&local_30.field_1);
      uStack_3c = cVar3.field_0._0_1_;
      bStack_3b = cVar3.field_0._1_1_;
      bStack_3a = cVar3.field_0._2_1_;
      bStack_39 = cVar3.field_0._3_1_;
    }
    auVar13[1] = local_48.m_comps[1];
    auVar13[0] = local_48.m_comps[0];
    auVar13[2] = local_48.m_comps[2];
    auVar13[3] = local_48.m_comps[3];
    auVar13[4] = cStack_44;
    auVar13[5] = cStack_43;
    auVar13[6] = cStack_42;
    auVar13[7] = cStack_41;
    auVar13[8] = cStack_40;
    auVar13[9] = cStack_3f;
    auVar13[10] = cStack_3e;
    auVar13[0xb] = cStack_3d;
    auVar13[0xc] = uStack_3c;
    auVar13[0xd] = bStack_3b;
    auVar13[0xe] = bStack_3a;
    auVar13[0xf] = bStack_39;
    auVar13 = pshufb(auVar13,_DAT_003284b0);
    auVar14._8_8_ = auVar13._8_8_;
    auVar14._0_8_ =
         auVar13._0_8_ & 0xff | (ulong)local_48.m_comps[1] << 8 | (ulong)bStack_3a << 0x10 |
         (ulong)local_48.m_comps[3] << 0x18 | (ulong)local_48.m_comps[0] << 0x20 |
         (ulong)bStack_3b << 0x28 | (ulong)local_48.m_comps[2] << 0x30 | (ulong)bStack_39 << 0x38;
    auVar13 = pmovzxbw(auVar14,auVar14);
    uVar12 = (ushort)(auVar13._0_2_ * 3 + auVar13._8_2_ * 5) >> 3;
    uVar15 = (ushort)(auVar13._2_2_ * 5 + auVar13._10_2_ * 3) >> 3;
    uVar16 = (ushort)(auVar13._4_2_ * 3 + auVar13._12_2_ * 5) >> 3;
    uVar17 = (ushort)(auVar13._6_2_ * 5 + auVar13._14_2_ * 3) >> 3;
    uVar18 = (ushort)(auVar13._8_2_ * 3 + auVar13._0_2_ * 5) >> 3;
    uVar19 = (ushort)(auVar13._10_2_ * 5 + auVar13._2_2_ * 3) >> 3;
    uVar20 = (ushort)(auVar13._12_2_ * 3 + auVar13._4_2_ * 5) >> 3;
    uVar21 = (ushort)(auVar13._14_2_ * 5 + auVar13._6_2_ * 3) >> 3;
    uVar12 = (ushort)(0xff < uVar12) * 0xff | (0xff >= uVar12) * uVar12;
    uVar15 = (ushort)(0xff < uVar15) * 0xff | (0xff >= uVar15) * uVar15;
    uVar16 = (ushort)(0xff < uVar16) * 0xff | (0xff >= uVar16) * uVar16;
    uVar17 = (ushort)(0xff < uVar17) * 0xff | (0xff >= uVar17) * uVar17;
    uVar18 = (ushort)(0xff < uVar18) * 0xff | (0xff >= uVar18) * uVar18;
    uVar19 = (ushort)(0xff < uVar19) * 0xff | (0xff >= uVar19) * uVar19;
    uVar20 = (ushort)(0xff < uVar20) * 0xff | (0xff >= uVar20) * uVar20;
    uVar21 = (ushort)(0xff < uVar21) * 0xff | (0xff >= uVar21) * uVar21;
    cStack_44 = (uVar12 != 0) * (uVar12 < 0x100) * (char)uVar12 - (0xff < uVar12);
    cStack_43 = (uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15);
    cStack_42 = (uVar16 != 0) * (uVar16 < 0x100) * (char)uVar16 - (0xff < uVar16);
    cStack_41 = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
    cStack_40 = (uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 - (0xff < uVar18);
    cStack_3f = (uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19);
    cStack_3e = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
    cStack_3d = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
    bVar2 = 0;
    uVar6 = 0;
    do {
      pPixels[uVar6].field_0 =
           (&local_48)[*(byte *)((long)p + (uVar6 >> 2 & 0x3fffffff)) >> (bVar2 & 6) & 3];
      uVar6 = uVar6 + 1;
      bVar2 = bVar2 + 2;
    } while (uVar6 != 0x10);
  }
  return (uVar1 & 0x8001) == 0x8000;
}

Assistant:

bool unpack_pvrtc2(const void *p, color_rgba *pPixels)
	{
		const pvrtc2_block* pBlock = static_cast<const pvrtc2_block*>(p);

		if ((!pBlock->m_opaque_color_data.m_hard_flag) || (pBlock->m_opaque_color_data.m_mod_flag))
		{
			// This mode isn't supported by the transcoder, so we aren't bothering with it here.
			return false;
		}

		color_rgba colors[4];

		if (pBlock->m_opaque_color_data.m_opaque_flag)
		{
			// colora=554
			color_rgba color_a(pBlock->m_opaque_color_data.m_red_a, pBlock->m_opaque_color_data.m_green_a, (pBlock->m_opaque_color_data.m_blue_a << 1) | (pBlock->m_opaque_color_data.m_blue_a >> 3), 255);
			
			// colora=555
			color_rgba color_b(pBlock->m_opaque_color_data.m_red_b, pBlock->m_opaque_color_data.m_green_b, pBlock->m_opaque_color_data.m_blue_b, 255);
						
			colors[0] = convert_rgb_555_to_888(color_a);
			colors[3] = convert_rgb_555_to_888(color_b);

			colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, 255);
			colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, 255);
		}
		else
		{
			// colora=4433 
			color_rgba color_a(
				(pBlock->m_trans_color_data.m_red_a << 1) | (pBlock->m_trans_color_data.m_red_a >> 3), 
				(pBlock->m_trans_color_data.m_green_a << 1) | (pBlock->m_trans_color_data.m_green_a >> 3),
				(pBlock->m_trans_color_data.m_blue_a << 2) | (pBlock->m_trans_color_data.m_blue_a >> 1), 
				pBlock->m_trans_color_data.m_alpha_a << 1);

			//colorb=4443
			color_rgba color_b(
				(pBlock->m_trans_color_data.m_red_b << 1) | (pBlock->m_trans_color_data.m_red_b >> 3),
				(pBlock->m_trans_color_data.m_green_b << 1) | (pBlock->m_trans_color_data.m_green_b >> 3),
				(pBlock->m_trans_color_data.m_blue_b << 1) | (pBlock->m_trans_color_data.m_blue_b >> 3),
				(pBlock->m_trans_color_data.m_alpha_b << 1) | 1);

			colors[0] = convert_rgba_5554_to_8888(color_a);
			colors[3] = convert_rgba_5554_to_8888(color_b);
		}

		colors[1].set((colors[0].r * 5 + colors[3].r * 3) / 8, (colors[0].g * 5 + colors[3].g * 3) / 8, (colors[0].b * 5 + colors[3].b * 3) / 8, (colors[0].a * 5 + colors[3].a * 3) / 8);
		colors[2].set((colors[0].r * 3 + colors[3].r * 5) / 8, (colors[0].g * 3 + colors[3].g * 5) / 8, (colors[0].b * 3 + colors[3].b * 5) / 8, (colors[0].a * 3 + colors[3].a * 5) / 8);

		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t sel = (pBlock->m_modulation[i >> 2] >> ((i & 3) * 2)) & 3;
			pPixels[i] = colors[sel];
		}

		return true;
	}